

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int listener_setup_ssl(h2o_configurator_command_t *cmd,h2o_configurator_context_t *ctx,
                      yoml_t *listen_node,yoml_t *ssl_node,listener_config_t *listener,
                      int listener_is_new)

{
  anon_union_24_4_f8a395d4_for_data *paVar1;
  yoml_t_conflict *node;
  yoml_t_conflict *node_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  SSL_METHOD *meth;
  SSL_CTX *ctx_00;
  BIO *bp;
  DH *dh;
  listener_ssl_config_t *plVar7;
  void *pvVar8;
  int iVar9;
  ulong new_capacity;
  char *pcVar10;
  yoml_t_conflict **ppyVar11;
  h2o_buffer_t **__size;
  yoml_t_conflict *node_01;
  size_t sVar12;
  char *pcVar13;
  bool bVar14;
  h2o_iovec_t hVar15;
  uint ocsp_max_failures;
  uint64_t ocsp_update_interval;
  char errbuf [256];
  ulong local_1a0;
  yoml_t_conflict *local_198;
  yoml_t_conflict *local_190;
  yoml_t_conflict *local_188;
  yoml_t_conflict *local_178;
  yoml_t_conflict *local_170;
  yoml_t_conflict *local_160;
  yoml_t_conflict *local_158;
  yoml_t_conflict *local_150;
  h2o_buffer_t *local_138 [33];
  
  if (listener_is_new == 0) {
    sVar12 = (listener->ssl).size;
    if (ssl_node == (yoml_t *)0x0 && sVar12 != 0) {
      pcVar13 = "cannot accept HTTP; already defined to accept HTTPS";
      goto LAB_0018ffaa;
    }
    if (ssl_node != (yoml_t *)0x0 && sVar12 == 0) {
      pcVar13 = "cannot accept HTTPS; already defined to accept HTTP";
      listen_node = ssl_node;
      goto LAB_0018ffaa;
    }
  }
  if (ssl_node == (yoml_t *)0x0) {
    return 0;
  }
  if (ssl_node->type != YOML_TYPE_MAPPING) {
    pcVar13 = "`ssl` is not a mapping";
    listen_node = ssl_node;
LAB_0018ffaa:
    h2o_configurator_errprintf(cmd,listen_node,pcVar13);
    return -1;
  }
  local_1a0 = 0x80000850;
  if ((ssl_node->data).scalar == (char *)0x0) {
    bVar2 = true;
    local_158 = (yoml_t_conflict *)0x0;
    local_150 = (yoml_t_conflict *)0x0;
    local_160 = (yoml_t_conflict *)0x0;
    node_01 = (yoml_t_conflict *)0x0;
    local_178 = (yoml_t_conflict *)0x0;
    local_170 = (yoml_t_conflict *)0x0;
    local_198 = (yoml_t_conflict *)0x0;
    local_190 = (yoml_t_conflict *)0x0;
    local_188 = (yoml_t_conflict *)0x0;
  }
  else {
    ppyVar11 = &(ssl_node->data).mapping.elements[0].value;
    bVar2 = true;
    local_188 = (yoml_t_conflict *)0x0;
    local_190 = (yoml_t_conflict *)0x0;
    local_198 = (yoml_t_conflict *)0x0;
    local_170 = (yoml_t_conflict *)0x0;
    local_178 = (yoml_t_conflict *)0x0;
    node_01 = (yoml_t_conflict *)0x0;
    local_160 = (yoml_t_conflict *)0x0;
    local_150 = (yoml_t_conflict *)0x0;
    local_158 = (yoml_t_conflict *)0x0;
    pcVar13 = (char *)0x0;
    do {
      node = ((yoml_mapping_element_t *)(ppyVar11 + -1))->key;
      if (node->type == YOML_TYPE_SCALAR) {
        node_00 = *ppyVar11;
        pcVar10 = (node->data).scalar;
        iVar3 = strcmp(pcVar10,"certificate-file");
        if (iVar3 == 0) {
          if (node_00->type != YOML_TYPE_SCALAR) {
            pcVar10 = "property of `certificate-file` must be a string";
            goto LAB_0018fe61;
          }
          iVar3 = 4;
          bVar14 = true;
          local_188 = node_00;
        }
        else {
          iVar3 = strcmp(pcVar10,"key-file");
          if (iVar3 == 0) {
            if (node_00->type == YOML_TYPE_SCALAR) {
              iVar3 = 4;
              bVar14 = true;
              local_190 = node_00;
              goto LAB_0018fe77;
            }
            pcVar10 = "property of `key-file` must be a string";
LAB_0018fe61:
            h2o_configurator_errprintf(cmd,node_00,pcVar10);
          }
          else {
            iVar3 = strcmp(pcVar10,"min-version");
            if (iVar3 == 0) {
              if (node_00->type == YOML_TYPE_SCALAR) {
LAB_0018fcbc:
                iVar3 = 4;
                bVar14 = true;
                local_170 = node_00;
                goto LAB_0018fe77;
              }
              pcVar10 = "property of `min-version` must be a string";
              goto LAB_0018fe61;
            }
            iVar3 = strcmp(pcVar10,"minimum-version");
            if (iVar3 == 0) {
              if (node_00->type == YOML_TYPE_SCALAR) goto LAB_0018fcbc;
              pcVar10 = "property of `minimum-version` must be a string";
              goto LAB_0018fe61;
            }
            iVar3 = strcmp(pcVar10,"max-version");
            if (iVar3 == 0) {
              if (node_00->type == YOML_TYPE_SCALAR) {
LAB_0018fd1c:
                iVar3 = 4;
                bVar14 = true;
                local_178 = node_00;
                goto LAB_0018fe77;
              }
              pcVar10 = "property of `max-version` must be a string";
              goto LAB_0018fe61;
            }
            iVar3 = strcmp(pcVar10,"maximum-version");
            if (iVar3 == 0) {
              if (node_00->type == YOML_TYPE_SCALAR) goto LAB_0018fd1c;
              pcVar10 = "property of `maximum-version` must be a string";
              goto LAB_0018fe61;
            }
            iVar3 = strcmp(pcVar10,"cipher-suite");
            if (iVar3 == 0) {
              if (node_00->type != YOML_TYPE_SCALAR) {
                pcVar10 = "property of `cipher-suite` must be a string";
                goto LAB_0018fe61;
              }
              iVar3 = 4;
              bVar14 = true;
              node_01 = node_00;
              goto LAB_0018fe77;
            }
            iVar3 = strcmp(pcVar10,"ocsp-update-cmd");
            if (iVar3 == 0) {
              if (node_00->type != YOML_TYPE_SCALAR) {
                pcVar10 = "property of `ocsp-update-cmd` must be a string";
                goto LAB_0018fe61;
              }
              iVar3 = 4;
              bVar14 = true;
              local_160 = node_00;
              goto LAB_0018fe77;
            }
            iVar3 = strcmp(pcVar10,"ocsp-update-interval");
            if (iVar3 == 0) {
              if (node_00->type != YOML_TYPE_SCALAR) {
                pcVar10 = "property of `ocsp-update-interval` must be a string";
                goto LAB_0018fe61;
              }
              iVar3 = 4;
              bVar14 = true;
              local_150 = node_00;
              goto LAB_0018fe77;
            }
            iVar3 = strcmp(pcVar10,"ocsp-max-failures");
            if (iVar3 == 0) {
              if (node_00->type != YOML_TYPE_SCALAR) {
                pcVar10 = "property of `ocsp-max-failures` must be a string";
                goto LAB_0018fe61;
              }
              iVar3 = 4;
              bVar14 = true;
              local_158 = node_00;
              goto LAB_0018fe77;
            }
            iVar3 = strcmp(pcVar10,"dh-file");
            if (iVar3 == 0) {
              if (node_00->type != YOML_TYPE_SCALAR) {
                pcVar10 = "property of `dh-file` must be a string";
                goto LAB_0018fe61;
              }
              iVar3 = 4;
              bVar14 = true;
              local_198 = node_00;
              goto LAB_0018fe77;
            }
            iVar3 = strcmp(pcVar10,"cipher-preference");
            if (iVar3 == 0) {
              if (node_00->type == YOML_TYPE_SCALAR) {
                iVar3 = strcasecmp((node_00->data).scalar,"client");
                if (iVar3 == 0) {
                  local_1a0 = local_1a0 & 0xffffffffffbfffff;
                }
                else {
                  iVar3 = strcasecmp((node_00->data).scalar,"server");
                  if (iVar3 != 0) goto LAB_0018fe10;
                  local_1a0 = local_1a0 | 0x400000;
                }
                iVar3 = 4;
                bVar14 = true;
              }
              else {
LAB_0018fe10:
                bVar14 = false;
                h2o_configurator_errprintf
                          (cmd,node_00,
                           "property of `cipher-preference` must be either of: `client`, `server`");
                iVar3 = 1;
              }
              goto LAB_0018fe77;
            }
            iVar3 = strcmp(pcVar10,"neverbleed");
            if (iVar3 == 0) {
              if (node_00->type != YOML_TYPE_SCALAR) {
LAB_0018fe4f:
                pcVar10 = "property of `neverbleed` must be either of: `ON`, `OFF";
                goto LAB_0018fe61;
              }
              iVar5 = strcasecmp((node_00->data).scalar,"ON");
              iVar3 = 4;
              bVar14 = true;
              if (iVar5 == 0) {
                bVar2 = true;
              }
              else {
                iVar5 = strcasecmp((node_00->data).scalar,"OFF");
                if (iVar5 != 0) goto LAB_0018fe4f;
                bVar2 = false;
              }
              goto LAB_0018fe77;
            }
            h2o_configurator_errprintf(cmd,node,"unknown property: %s");
          }
          bVar14 = false;
          iVar3 = 1;
        }
      }
      else {
        bVar14 = false;
        h2o_configurator_errprintf
                  ((h2o_configurator_command_t *)0x0,node,"command must be a string");
        iVar3 = 1;
      }
LAB_0018fe77:
      if (!bVar14) {
        uVar4 = 1;
        goto LAB_001901d5;
      }
      pcVar13 = pcVar13 + 1;
      ppyVar11 = ppyVar11 + 2;
    } while (pcVar13 != (ssl_node->data).scalar);
  }
  if (local_188 == (yoml_t_conflict *)0x0) {
    pcVar13 = "could not find mandatory property `certificate-file`";
    local_188 = (yoml_t_conflict *)0x0;
LAB_00190129:
    h2o_configurator_errprintf(cmd,ssl_node,pcVar13);
    uVar4 = 1;
    iVar3 = 1;
  }
  else {
    if (local_190 == (yoml_t_conflict *)0x0) {
      pcVar13 = "could not find mandatory property `key-file`";
      local_190 = (yoml_t_conflict *)0x0;
      goto LAB_00190129;
    }
    if (local_170 == (yoml_t_conflict *)0x0) {
LAB_00190146:
      local_1a0 = local_1a0 | 0x2000000;
    }
    else {
      pcVar13 = (local_170->data).scalar;
      iVar3 = strcasecmp(pcVar13,"sslv2");
      if ((iVar3 != 0) && (iVar3 = strcasecmp(pcVar13,"sslv3"), iVar3 != 0)) {
        iVar3 = strcasecmp(pcVar13,"tlsv1");
        if (iVar3 == 0) goto LAB_00190146;
        iVar3 = strcasecmp(pcVar13,"tlsv1.1");
        if (iVar3 == 0) {
          local_1a0 = local_1a0 | 0x6000000;
        }
        else {
          iVar3 = strcasecmp(pcVar13,"tlsv1.2");
          if (iVar3 == 0) {
            local_1a0 = local_1a0 | 0x16000000;
          }
          else {
            iVar3 = strcasecmp(pcVar13,"tlsv1.3");
            if (iVar3 == 0) {
              local_1a0 = local_1a0 | 0x1e000000;
            }
            else {
              h2o_configurator_errprintf(cmd,local_170,"unknown protocol version: %s");
            }
          }
        }
      }
    }
    if (local_178 == (yoml_t_conflict *)0x0) {
      uVar4 = 1;
    }
    else {
      uVar4 = strcasecmp((local_178->data).scalar,"tlsv1.3");
      uVar4 = ~uVar4 >> 0x1f;
    }
    if (local_150 == (yoml_t_conflict *)0x0) {
LAB_001901aa:
      if (local_158 != (yoml_t_conflict *)0x0) {
        iVar5 = h2o_configurator_scanf(cmd,local_158,"%u");
        iVar3 = 6;
        if (iVar5 != 0) goto LAB_001901d5;
      }
      iVar3 = 0;
    }
    else {
      iVar5 = h2o_configurator_scanf(cmd,local_150,"%lu");
      iVar3 = 6;
      if (iVar5 == 0) goto LAB_001901aa;
    }
  }
LAB_001901d5:
  if (iVar3 == 6) {
    ctx_00 = (SSL_CTX *)0x0;
    goto LAB_0019034b;
  }
  if (iVar3 != 0) {
    return -1;
  }
  if (ctx->hostconf == (h2o_hostconf_t *)0x0) {
    iVar3 = -1;
  }
  else {
    bVar14 = (listener->ssl).size == 0;
    iVar3 = -1;
    if (!bVar14) {
      sVar12 = 0;
      do {
        plVar7 = (listener->ssl).entries[sVar12];
        iVar5 = strcmp(plVar7->certificate_file,(local_188->data).scalar);
        if (iVar5 == 0) {
          listener_setup_ssl_add_host(plVar7,(ctx->hostconf->authority).hostport);
          iVar3 = 0;
          break;
        }
        sVar12 = sVar12 + 1;
        bVar14 = sVar12 == (listener->ssl).size;
      } while (!bVar14);
    }
    if (!bVar14) {
      return iVar3;
    }
  }
  meth = (SSL_METHOD *)TLS_server_method();
  ctx_00 = SSL_CTX_new(meth);
  SSL_CTX_set_options(ctx_00,local_1a0 | 0x20000);
  iVar5 = SSL_CTX_use_certificate_chain_file(ctx_00,(local_188->data).scalar);
  if (iVar5 == 1) {
    if ((bVar2) && (1 < conf.run_mode - RUN_MODE_MASTER)) {
      if (neverbleed == (neverbleed_t *)0x0) {
        neverbleed = (neverbleed_t *)h2o_mem_alloc(0xa0);
        iVar5 = neverbleed_init(neverbleed,(char *)local_138);
        if (iVar5 != 0) {
          __size = local_138;
          listener_setup_ssl_cold_1();
          pvVar8 = malloc((size_t)__size);
          if (pvVar8 == (void *)0x0) {
            h2o__fatal(
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                      );
          }
          return (int)pvVar8;
        }
      }
      iVar5 = neverbleed_load_private_key_file
                        (neverbleed,(SSL_CTX *)ctx_00,(local_190->data).scalar,(char *)local_138);
      iVar9 = 0;
      if (iVar5 != 1) {
        h2o_configurator_errprintf
                  (cmd,local_190,"failed to load private key file:%s:%s\n",(local_190->data).scalar,
                   local_138);
        iVar9 = 6;
      }
      if (iVar9 != 0) {
        if (iVar9 != 6) {
          return iVar3;
        }
        goto LAB_0019034b;
      }
    }
    else {
      iVar5 = SSL_CTX_use_PrivateKey_file(ctx_00,(local_190->data).scalar,1);
      if (iVar5 != 1) {
        pcVar13 = (local_190->data).scalar;
        pcVar10 = "failed to load private key file:%s\n";
        local_188 = local_190;
        goto LAB_0019032e;
      }
    }
    if ((node_01 == (yoml_t_conflict *)0x0) ||
       (iVar5 = SSL_CTX_set_cipher_list(ctx_00,(node_01->data).scalar), iVar5 == 1)) {
      if (local_198 != (yoml_t_conflict *)0x0) {
        bp = BIO_new_file((local_198->data).scalar,"r");
        if (bp == (BIO *)0x0) {
          pcVar13 = (local_198->data).scalar;
LAB_001904f6:
          h2o_configurator_errprintf(cmd,local_198,"failed to load dhparam file:%s\n",pcVar13);
          ERR_print_errors_cb(on_openssl_print_errors,_stderr);
          iVar5 = 6;
        }
        else {
          iVar5 = 0;
          dh = PEM_read_bio_DHparams(bp,(DH **)0x0,(undefined1 *)0x0,(void *)0x0);
          BIO_free(bp);
          if (dh == (DH *)0x0) {
            pcVar13 = (local_198->data).scalar;
            goto LAB_001904f6;
          }
          SSL_CTX_ctrl(ctx_00,3,0,dh);
          SSL_CTX_set_options(ctx_00,0);
          DH_free(dh);
        }
        if (iVar5 == 6) goto LAB_0019034b;
        if (iVar5 != 0) {
          return iVar3;
        }
      }
      h2o_ssl_register_npn_protocols((SSL_CTX *)ctx_00,h2o_npn_protocols);
      h2o_ssl_register_alpn_protocols((SSL_CTX *)ctx_00,h2o_alpn_protocols);
      if ((listener->ssl).size == 1) {
        SSL_CTX_callback_ctrl((SSL_CTX *)(*(listener->ssl).entries)->ctx,0x35,on_sni_callback);
        SSL_CTX_ctrl((SSL_CTX *)(*(listener->ssl).entries)->ctx,0x36,0,listener);
      }
      plVar7 = (listener_ssl_config_t *)h2o_mem_alloc(0x78);
      (plVar7->hostnames).entries = (h2o_iovec_t *)0x0;
      (plVar7->hostnames).size = 0;
      (plVar7->hostnames).capacity = 0;
      plVar7->certificate_file = (char *)0x0;
      plVar7->ctx = (SSL_CTX *)0x0;
      (plVar7->ocsp_stapling).interval = 0;
      *(undefined8 *)&(plVar7->ocsp_stapling).max_failures = 0;
      (plVar7->ocsp_stapling).cmd = (char *)0x0;
      (plVar7->ocsp_stapling).updater_tid = 0;
      (plVar7->ocsp_stapling).response.mutex.__align = 0;
      *(undefined8 *)((long)&(plVar7->ocsp_stapling).response.mutex + 8) = 0;
      *(undefined8 *)((long)&(plVar7->ocsp_stapling).response.mutex + 0x10) = 0;
      (plVar7->ocsp_stapling).response.mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
      (plVar7->ocsp_stapling).response.mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
      (plVar7->ocsp_stapling).response.data = (h2o_buffer_t *)0x0;
      new_capacity = (listener->ssl).size + 1;
      if ((listener->ssl).capacity < new_capacity) {
        h2o_vector__expand((h2o_mem_pool_t *)0x0,(h2o_vector_t *)&listener->ssl,8,new_capacity);
      }
      paVar1 = &local_188->data;
      sVar12 = (listener->ssl).size;
      (listener->ssl).size = sVar12 + 1;
      (listener->ssl).entries[sVar12] = plVar7;
      if (ctx->hostconf != (h2o_hostconf_t *)0x0) {
        listener_setup_ssl_add_host(plVar7,(ctx->hostconf->authority).hostport);
      }
      plVar7->ctx = (SSL_CTX *)ctx_00;
      hVar15 = h2o_strdup((h2o_mem_pool_t *)0x0,paVar1->scalar,0xffffffffffffffff);
      plVar7->certificate_file = hVar15.base;
      SSL_CTX_callback_ctrl(ctx_00,0x3f,on_staple_ocsp_ossl);
      SSL_CTX_ctrl(ctx_00,0x40,0,plVar7);
      pthread_mutex_init((pthread_mutex_t *)&(plVar7->ocsp_stapling).response,
                         (pthread_mutexattr_t *)0x0);
      if (local_160 == (yoml_t_conflict *)0x0) {
        pcVar13 = "share/h2o/fetch-ocsp-response";
      }
      else {
        hVar15 = h2o_strdup((h2o_mem_pool_t *)0x0,(local_160->data).scalar,0xffffffffffffffff);
        pcVar13 = hVar15.base;
      }
      (plVar7->ocsp_stapling).cmd = pcVar13;
      if (conf.run_mode == RUN_MODE_WORKER) {
        (plVar7->ocsp_stapling).interval = 0x3840;
        (plVar7->ocsp_stapling).max_failures = 3;
        h2o_multithread_create_thread
                  (&(plVar7->ocsp_stapling).updater_tid,(pthread_attr_t *)0x0,ocsp_updater_thread,
                   plVar7);
      }
      else if (conf.run_mode == RUN_MODE_TEST) {
        fprintf(_stderr,"[OCSP Stapling] testing for certificate file:%s\n",paVar1->scalar);
        uVar6 = get_ocsp_response(paVar1->scalar,(plVar7->ocsp_stapling).cmd,local_138);
        if ((char)uVar6 == 'K') {
          pcVar13 = (local_188->data).scalar;
          pcVar10 = "[OCSP Stapling] temporary failed for file:%s\n";
        }
        else {
          if ((uVar6 & 0xff) == 0) {
            listener_setup_ssl_cold_2();
            goto LAB_00190741;
          }
          pcVar13 = (local_188->data).scalar;
          pcVar10 = "[OCSP Stapling] does not work, will be disabled for file:%s\n";
        }
        h2o_configurator_errprintf(cmd,local_188,pcVar10,pcVar13);
      }
LAB_00190741:
      if (uVar4 == 0) {
        return 0;
      }
      pcVar13 = listener_setup_ssl_picotls(listener,plVar7,(SSL_CTX *)ctx_00);
      if (pcVar13 != (char *)0x0) {
        h2o_configurator_errprintf(cmd,ssl_node,"%s; TLS 1.3 will be disabled\n",pcVar13);
        return 0;
      }
      return 0;
    }
    h2o_configurator_errprintf(cmd,node_01,"failed to setup SSL cipher suite\n");
  }
  else {
    pcVar13 = (local_188->data).scalar;
    pcVar10 = "failed to load certificate file:%s\n";
LAB_0019032e:
    h2o_configurator_errprintf(cmd,local_188,pcVar10,pcVar13);
  }
  ERR_print_errors_cb(on_openssl_print_errors,_stderr);
LAB_0019034b:
  if (ctx_00 == (SSL_CTX *)0x0) {
    return -1;
  }
  SSL_CTX_free(ctx_00);
  return -1;
}

Assistant:

static int listener_setup_ssl(h2o_configurator_command_t *cmd, h2o_configurator_context_t *ctx, yoml_t *listen_node,
                              yoml_t *ssl_node, struct listener_config_t *listener, int listener_is_new)
{
    SSL_CTX *ssl_ctx = NULL;
    yoml_t *certificate_file = NULL, *key_file = NULL, *dh_file = NULL, *min_version = NULL, *max_version = NULL,
           *cipher_suite = NULL, *ocsp_update_cmd = NULL, *ocsp_update_interval_node = NULL, *ocsp_max_failures_node = NULL;
    long ssl_options = SSL_OP_ALL;
    uint64_t ocsp_update_interval = 4 * 60 * 60; /* defaults to 4 hours */
    unsigned ocsp_max_failures = 3;              /* defaults to 3; permit 3 failures before temporary disabling OCSP stapling */
    int use_neverbleed = 1, use_picotls = 1;     /* enabled by default */

    if (!listener_is_new) {
        if (listener->ssl.size != 0 && ssl_node == NULL) {
            h2o_configurator_errprintf(cmd, listen_node, "cannot accept HTTP; already defined to accept HTTPS");
            return -1;
        }
        if (listener->ssl.size == 0 && ssl_node != NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "cannot accept HTTPS; already defined to accept HTTP");
            return -1;
        }
    }

    if (ssl_node == NULL)
        return 0;
    if (ssl_node->type != YOML_TYPE_MAPPING) {
        h2o_configurator_errprintf(cmd, ssl_node, "`ssl` is not a mapping");
        return -1;
    }

    { /* parse */
        size_t i;
        for (i = 0; i != ssl_node->data.sequence.size; ++i) {
            yoml_t *key = ssl_node->data.mapping.elements[i].key, *value = ssl_node->data.mapping.elements[i].value;
            /* obtain the target command */
            if (key->type != YOML_TYPE_SCALAR) {
                h2o_configurator_errprintf(NULL, key, "command must be a string");
                return -1;
            }
#define FETCH_PROPERTY(n, p)                                                                                                       \
    if (strcmp(key->data.scalar, n) == 0) {                                                                                        \
        if (value->type != YOML_TYPE_SCALAR) {                                                                                     \
            h2o_configurator_errprintf(cmd, value, "property of `" n "` must be a string");                                        \
            return -1;                                                                                                             \
        }                                                                                                                          \
        p = value;                                                                                                                 \
        continue;                                                                                                                  \
    }
            FETCH_PROPERTY("certificate-file", certificate_file);
            FETCH_PROPERTY("key-file", key_file);
            FETCH_PROPERTY("min-version", min_version);
            FETCH_PROPERTY("minimum-version", min_version);
            FETCH_PROPERTY("max-version", max_version);
            FETCH_PROPERTY("maximum-version", max_version);
            FETCH_PROPERTY("cipher-suite", cipher_suite);
            FETCH_PROPERTY("ocsp-update-cmd", ocsp_update_cmd);
            FETCH_PROPERTY("ocsp-update-interval", ocsp_update_interval_node);
            FETCH_PROPERTY("ocsp-max-failures", ocsp_max_failures_node);
            FETCH_PROPERTY("dh-file", dh_file);
            if (strcmp(key->data.scalar, "cipher-preference") == 0) {
                if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "client") == 0) {
                    ssl_options &= ~SSL_OP_CIPHER_SERVER_PREFERENCE;
                } else if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "server") == 0) {
                    ssl_options |= SSL_OP_CIPHER_SERVER_PREFERENCE;
                } else {
                    h2o_configurator_errprintf(cmd, value, "property of `cipher-preference` must be either of: `client`, `server`");
                    return -1;
                }
                continue;
            }
            if (strcmp(key->data.scalar, "neverbleed") == 0) {
                if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "ON") == 0) {
                    /* no need to enable neverbleed for daemon / master */
                    use_neverbleed = 1;
                } else if (value->type == YOML_TYPE_SCALAR && strcasecmp(value->data.scalar, "OFF") == 0) {
                    use_neverbleed = 0;
                } else {
                    h2o_configurator_errprintf(cmd, value, "property of `neverbleed` must be either of: `ON`, `OFF");
                    return -1;
                }
                continue;
            }
            h2o_configurator_errprintf(cmd, key, "unknown property: %s", key->data.scalar);
            return -1;
#undef FETCH_PROPERTY
        }
        if (certificate_file == NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "could not find mandatory property `certificate-file`");
            return -1;
        }
        if (key_file == NULL) {
            h2o_configurator_errprintf(cmd, ssl_node, "could not find mandatory property `key-file`");
            return -1;
        }
        if (min_version != NULL) {
#define MAP(tok, op)                                                                                                               \
    if (strcasecmp(min_version->data.scalar, tok) == 0) {                                                                          \
        ssl_options |= (op);                                                                                                       \
        goto VersionFound;                                                                                                         \
    }
            MAP("sslv2", 0);
            MAP("sslv3", SSL_OP_NO_SSLv2);
            MAP("tlsv1", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3);
            MAP("tlsv1.1", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1);
#ifdef SSL_OP_NO_TLSv1_1
            MAP("tlsv1.2", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1 | SSL_OP_NO_TLSv1_1);
#endif
#ifdef SSL_OP_NO_TLSv1_2
            MAP("tlsv1.3", SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3 | SSL_OP_NO_TLSv1 | SSL_OP_NO_TLSv1_1 | SSL_OP_NO_TLSv1_2);
#endif
#undef MAP
            h2o_configurator_errprintf(cmd, min_version, "unknown protocol version: %s", min_version->data.scalar);
        VersionFound:;
        } else {
            /* default is >= TLSv1 */
            ssl_options |= SSL_OP_NO_SSLv2 | SSL_OP_NO_SSLv3;
        }
        if (max_version != NULL) {
            if (strcasecmp(max_version->data.scalar, "tlsv1.3") < 0)
                use_picotls = 0;
        }
        if (ocsp_update_interval_node != NULL) {
            if (h2o_configurator_scanf(cmd, ocsp_update_interval_node, "%" PRIu64, &ocsp_update_interval) != 0)
                goto Error;
        }
        if (ocsp_max_failures_node != NULL) {
            if (h2o_configurator_scanf(cmd, ocsp_max_failures_node, "%u", &ocsp_max_failures) != 0)
                goto Error;
        }
    }

    /* add the host to the existing SSL config, if the certificate file is already registered */
    if (ctx->hostconf != NULL) {
        size_t i;
        for (i = 0; i != listener->ssl.size; ++i) {
            struct listener_ssl_config_t *ssl_config = listener->ssl.entries[i];
            if (strcmp(ssl_config->certificate_file, certificate_file->data.scalar) == 0) {
                listener_setup_ssl_add_host(ssl_config, ctx->hostconf->authority.hostport);
                return 0;
            }
        }
    }

/* disable tls compression to avoid "CRIME" attacks (see http://en.wikipedia.org/wiki/CRIME) */
#ifdef SSL_OP_NO_COMPRESSION
    ssl_options |= SSL_OP_NO_COMPRESSION;
#endif

    /* setup */
    ssl_ctx = SSL_CTX_new(SSLv23_server_method());
    SSL_CTX_set_options(ssl_ctx, ssl_options);

    setup_ecc_key(ssl_ctx);
    if (SSL_CTX_use_certificate_chain_file(ssl_ctx, certificate_file->data.scalar) != 1) {
        h2o_configurator_errprintf(cmd, certificate_file, "failed to load certificate file:%s\n", certificate_file->data.scalar);
        ERR_print_errors_cb(on_openssl_print_errors, stderr);
        goto Error;
    }
    if (use_neverbleed) {
        /* disable neverbleed in case the process is not going to serve requests */
        switch (conf.run_mode) {
        case RUN_MODE_DAEMON:
        case RUN_MODE_MASTER:
            use_neverbleed = 0;
            break;
        default:
            break;
        }
    }
    if (use_neverbleed) {
        char errbuf[NEVERBLEED_ERRBUF_SIZE];
        if (neverbleed == NULL) {
            neverbleed = h2o_mem_alloc(sizeof(*neverbleed));
            if (neverbleed_init(neverbleed, errbuf) != 0) {
                fprintf(stderr, "%s\n", errbuf);
                abort();
            }
        }
        if (neverbleed_load_private_key_file(neverbleed, ssl_ctx, key_file->data.scalar, errbuf) != 1) {
            h2o_configurator_errprintf(cmd, key_file, "failed to load private key file:%s:%s\n", key_file->data.scalar, errbuf);
            goto Error;
        }
    } else {
        if (SSL_CTX_use_PrivateKey_file(ssl_ctx, key_file->data.scalar, SSL_FILETYPE_PEM) != 1) {
            h2o_configurator_errprintf(cmd, key_file, "failed to load private key file:%s\n", key_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
    }
    if (cipher_suite != NULL && SSL_CTX_set_cipher_list(ssl_ctx, cipher_suite->data.scalar) != 1) {
        h2o_configurator_errprintf(cmd, cipher_suite, "failed to setup SSL cipher suite\n");
        ERR_print_errors_cb(on_openssl_print_errors, stderr);
        goto Error;
    }
    if (dh_file != NULL) {
        BIO *bio = BIO_new_file(dh_file->data.scalar, "r");
        if (bio == NULL) {
            h2o_configurator_errprintf(cmd, dh_file, "failed to load dhparam file:%s\n", dh_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
        DH *dh = PEM_read_bio_DHparams(bio, NULL, NULL, NULL);
        BIO_free(bio);
        if (dh == NULL) {
            h2o_configurator_errprintf(cmd, dh_file, "failed to load dhparam file:%s\n", dh_file->data.scalar);
            ERR_print_errors_cb(on_openssl_print_errors, stderr);
            goto Error;
        }
        SSL_CTX_set_tmp_dh(ssl_ctx, dh);
        SSL_CTX_set_options(ssl_ctx, SSL_OP_SINGLE_DH_USE);
        DH_free(dh);
    }

/* setup protocol negotiation methods */
#if H2O_USE_NPN
    h2o_ssl_register_npn_protocols(ssl_ctx, h2o_npn_protocols);
#endif
#if H2O_USE_ALPN
    h2o_ssl_register_alpn_protocols(ssl_ctx, h2o_alpn_protocols);
#endif

    /* set SNI callback to the first SSL context, when and only when it should be used */
    if (listener->ssl.size == 1) {
        SSL_CTX_set_tlsext_servername_callback(listener->ssl.entries[0]->ctx, on_sni_callback);
        SSL_CTX_set_tlsext_servername_arg(listener->ssl.entries[0]->ctx, listener);
    }

    /* create a new entry in the SSL context list */
    struct listener_ssl_config_t *ssl_config = h2o_mem_alloc(sizeof(*ssl_config));
    memset(ssl_config, 0, sizeof(*ssl_config));
    h2o_vector_reserve(NULL, &listener->ssl, listener->ssl.size + 1);
    listener->ssl.entries[listener->ssl.size++] = ssl_config;
    if (ctx->hostconf != NULL) {
        listener_setup_ssl_add_host(ssl_config, ctx->hostconf->authority.hostport);
    }
    ssl_config->ctx = ssl_ctx;
    ssl_config->certificate_file = h2o_strdup(NULL, certificate_file->data.scalar, SIZE_MAX).base;

#if !H2O_USE_OCSP
    if (ocsp_update_interval != 0)
        fprintf(stderr, "[OCSP Stapling] disabled (not support by the SSL library)\n");
#else
#ifndef OPENSSL_NO_OCSP
    SSL_CTX_set_tlsext_status_cb(ssl_ctx, on_staple_ocsp_ossl);
    SSL_CTX_set_tlsext_status_arg(ssl_ctx, ssl_config);
#endif
    pthread_mutex_init(&ssl_config->ocsp_stapling.response.mutex, NULL);
    ssl_config->ocsp_stapling.cmd =
        ocsp_update_cmd != NULL ? h2o_strdup(NULL, ocsp_update_cmd->data.scalar, SIZE_MAX).base : "share/h2o/fetch-ocsp-response";
    if (ocsp_update_interval != 0) {
        switch (conf.run_mode) {
        case RUN_MODE_WORKER:
            ssl_config->ocsp_stapling.interval =
                ocsp_update_interval; /* is also used as a flag for indicating if the updater thread was spawned */
            ssl_config->ocsp_stapling.max_failures = ocsp_max_failures;
            h2o_multithread_create_thread(&ssl_config->ocsp_stapling.updater_tid, NULL, ocsp_updater_thread, ssl_config);
            break;
        case RUN_MODE_MASTER:
        case RUN_MODE_DAEMON:
            /* nothing to do */
            break;
        case RUN_MODE_TEST: {
            h2o_buffer_t *respbuf;
            fprintf(stderr, "[OCSP Stapling] testing for certificate file:%s\n", certificate_file->data.scalar);
            switch (get_ocsp_response(certificate_file->data.scalar, ssl_config->ocsp_stapling.cmd, &respbuf)) {
            case 0:
                h2o_buffer_dispose(&respbuf);
                fprintf(stderr, "[OCSP Stapling] stapling works for file:%s\n", certificate_file->data.scalar);
                break;
            case EX_TEMPFAIL:
                h2o_configurator_errprintf(cmd, certificate_file, "[OCSP Stapling] temporary failed for file:%s\n",
                                           certificate_file->data.scalar);
                break;
            default:
                h2o_configurator_errprintf(cmd, certificate_file, "[OCSP Stapling] does not work, will be disabled for file:%s\n",
                                           certificate_file->data.scalar);
                break;
            }
        } break;
        }
    }
#endif

#if H2O_USE_PICOTLS
    if (use_picotls) {
        const char *errstr = listener_setup_ssl_picotls(listener, ssl_config, ssl_ctx);
        if (errstr != NULL)
            h2o_configurator_errprintf(cmd, ssl_node, "%s; TLS 1.3 will be disabled\n", errstr);
    }
#endif

    return 0;

Error:
    if (ssl_ctx != NULL)
        SSL_CTX_free(ssl_ctx);
    return -1;
}